

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O3

void __thiscall gnilk::IPCFifoUnix::Read(IPCFifoUnix *this)

{
  size_t in_RDX;
  void *in_RSI;
  
  Read((IPCFifoUnix *)&this[-1].fifofd,in_RSI,in_RDX);
  return;
}

Assistant:

int32_t IPCFifoUnix::Read(void *dstBuffer, size_t maxBytes) {
    if (!isOpen) {
        return -1;
    }
    if (!Available()) {
        return 0;
    }
    auto res = read(rwfd, dstBuffer, maxBytes);
    if (res < 0) {
        perror("IPCFifoUnix::Read");
    }
    return res;
}